

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

void __thiscall
draco::PointCloud::SetAttribute
          (PointCloud *this,int att_id,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  PointAttribute *pPVar1;
  long lVar2;
  uint32_t local_24;
  
  local_24 = att_id;
  if ((int)((ulong)((long)(this->attributes_).
                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= att_id) {
    std::
    vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ::resize(&this->attributes_,(long)(att_id + 1));
  }
  pPVar1 = (pa->_M_t).
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  lVar2 = (long)(pPVar1->super_GeometryAttribute).attribute_type_;
  if (lVar2 < 5) {
    std::vector<int,_std::allocator<int>_>::push_back
              (this->named_attribute_index_ + lVar2,(value_type_conflict1 *)&local_24);
    pPVar1 = (pa->_M_t).
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    att_id = local_24;
  }
  (pPVar1->super_GeometryAttribute).unique_id_ = att_id;
  std::__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
  operator=((__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
            ((this->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + att_id),
            (__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
            pa);
  return;
}

Assistant:

void PointCloud::SetAttribute(int att_id, std::unique_ptr<PointAttribute> pa) {
  DRACO_DCHECK(att_id >= 0);
  if (static_cast<int>(attributes_.size()) <= att_id) {
    attributes_.resize(att_id + 1);
  }
  if (pa->attribute_type() < GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    named_attribute_index_[pa->attribute_type()].push_back(att_id);
  }
  pa->set_unique_id(att_id);
  attributes_[att_id] = std::move(pa);
}